

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

nng_err nni_http_copy_body(nng_http *conn,void *data,size_t size)

{
  nng_err nVar1;
  nni_http_entity *entity;
  
  entity = &(conn->res).data;
  if (conn->client != false) {
    entity = &(conn->req).data;
  }
  nVar1 = http_copy_data(entity,data,size);
  if (nVar1 == NNG_OK) {
    nni_http_set_content_length(conn,size);
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_copy_body(nng_http *conn, const void *data, size_t size)
{
	nng_err rv;
	if (conn->client) {
		rv = http_copy_data(&conn->req.data, data, size);
	} else {
		rv = http_copy_data(&conn->res.data, data, size);
	}
	if (rv == NNG_OK) {
		nni_http_set_content_length(conn, size);
	}
	return (rv);
}